

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_ctl.c
# Opt level: O0

t_int * line_tilde_perf8(t_int *w)

{
  float fVar1;
  long lVar2;
  int iVar3;
  float local_30;
  t_sample f_2;
  t_sample f_1;
  int nticks;
  t_sample f;
  int n;
  t_sample *out;
  t_line *x;
  t_int *w_local;
  
  lVar2 = w[1];
  _f = (float *)w[2];
  nticks = (int)w[3];
  iVar3 = PD_BIGORSMALL(*(t_float *)(lVar2 + 0x34));
  if (iVar3 != 0) {
    *(undefined4 *)(lVar2 + 0x34) = 0;
  }
  if (*(int *)(lVar2 + 0x54) != 0) {
    f_2 = (t_sample)(int)(*(float *)(lVar2 + 0x4c) * *(float *)(lVar2 + 0x44));
    if (f_2 == 0.0) {
      f_2 = 1.4013e-45;
    }
    *(t_sample *)(lVar2 + 0x50) = f_2;
    *(float *)(lVar2 + 0x38) =
         (*(float *)(lVar2 + 0x30) - *(float *)(lVar2 + 0x34)) / (float)(int)f_2;
    *(float *)(lVar2 + 0x3c) = *(float *)(lVar2 + 0x40) * *(float *)(lVar2 + 0x38);
    *(undefined4 *)(lVar2 + 0x54) = 0;
  }
  if (*(int *)(lVar2 + 0x50) == 0) {
    fVar1 = *(float *)(lVar2 + 0x30);
    *(float *)(lVar2 + 0x34) = fVar1;
    for (; nticks != 0; nticks = nticks + -8) {
      *_f = fVar1;
      _f[1] = fVar1;
      _f[2] = fVar1;
      _f[3] = fVar1;
      _f[4] = fVar1;
      _f[5] = fVar1;
      _f[6] = fVar1;
      _f[7] = fVar1;
      _f = _f + 8;
    }
  }
  else {
    local_30 = *(float *)(lVar2 + 0x34);
    while (nticks != 0) {
      *_f = local_30;
      local_30 = *(float *)(lVar2 + 0x3c) + local_30;
      nticks = nticks + -1;
      _f = _f + 1;
    }
    *(float *)(lVar2 + 0x34) = *(float *)(lVar2 + 0x38) + *(float *)(lVar2 + 0x34);
    *(int *)(lVar2 + 0x50) = *(int *)(lVar2 + 0x50) + -1;
  }
  return w + 4;
}

Assistant:

static t_int *line_tilde_perf8(t_int *w)
{
    t_line *x = (t_line *)(w[1]);
    t_sample *out = (t_sample *)(w[2]);
    int n = (int)(w[3]);
    t_sample f = x->x_value;

    if (PD_BIGORSMALL(f))
        x->x_value = f = 0;
    if (x->x_retarget)
    {
        int nticks = x->x_inletwas * x->x_dspticktomsec;
        if (!nticks) nticks = 1;
        x->x_ticksleft = nticks;
        x->x_biginc = (x->x_target - x->x_value)/(t_sample)nticks;
        x->x_inc = x->x_1overn * x->x_biginc;
        x->x_retarget = 0;
    }
    if (x->x_ticksleft)
    {
        t_sample f = x->x_value;
        while (n--) *out++ = f, f += x->x_inc;
        x->x_value += x->x_biginc;
        x->x_ticksleft--;
    }
    else
    {
        t_sample f = x->x_value = x->x_target;
        for (; n; n -= 8, out += 8)
        {
            out[0] = f; out[1] = f; out[2] = f; out[3] = f;
            out[4] = f; out[5] = f; out[6] = f; out[7] = f;
        }
    }
    return (w+4);
}